

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::verifyUniformValue3f
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,float x,
               float y,float z)

{
  float location_00;
  float program_00;
  CallLogWrapper *this;
  bool bVar1;
  qpTestResult qVar2;
  float (*pafVar3) [3];
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1d0;
  undefined1 local_50 [8];
  StateQueryMemoryWriteGuard<float[3]> state;
  float z_local;
  float y_local;
  float x_local;
  GLint location_local;
  GLuint program_local;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  state.m_postguard[1] = z;
  state.m_postguard[2] = y;
  z_local = x;
  y_local = (float)location;
  x_local = (float)program;
  _location_local = gl;
  gl_local = (CallLogWrapper *)testCtx;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[3]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<float[3]> *)local_50);
  this = _location_local;
  program_00 = x_local;
  location_00 = y_local;
  pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_50);
  glu::CallLogWrapper::glGetUniformfv(this,(GLuint)program_00,(GLint)location_00,*pafVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[3]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<float[3]> *)local_50,(TestContext *)gl_local);
  if (bVar1) {
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_50);
    if (((*pafVar3)[0] == z_local) && (!NAN((*pafVar3)[0]) && !NAN(z_local))) {
      pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_50);
      if (((*pafVar3)[1] == state.m_postguard[2]) &&
         (!NAN((*pafVar3)[1]) && !NAN(state.m_postguard[2]))) {
        pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_50);
        if (((*pafVar3)[2] == state.m_postguard[1]) &&
           (!NAN((*pafVar3)[2]) && !NAN(state.m_postguard[1]))) {
          return;
        }
      }
    }
    this_00 = tcu::TestContext::getLog((TestContext *)gl_local);
    tcu::TestLog::operator<<(&local_1d0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [21])"// ERROR: expected [");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&z_local);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,state.m_postguard + 2);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,state.m_postguard + 1);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [9])"]; got [");
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_50);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*pafVar3);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_50);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*pafVar3 + 1);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_50);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*pafVar3 + 2);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    qVar2 = tcu::TestContext::getTestResult((TestContext *)gl_local);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((TestContext *)gl_local,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  return;
}

Assistant:

void verifyUniformValue3f (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, float x, float y, float z)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[3]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x ||
		state[1] != y ||
		state[2] != z)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x << ", "
		<< y << ", "
		<< z
		<< "]; got ["
		<< state[0] << ", "
		<< state[1] << ", "
		<< state[2]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}